

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.h
# Opt level: O0

void __thiscall internalJSONNode::internalJSONNode(internalJSONNode *this,char mytype)

{
  json_string *pjVar1;
  size_t *psVar2;
  jsonChildren *local_60;
  char mytype_local;
  internalJSONNode *this_local;
  
  this->_type = mytype;
  std::__cxx11::string::string((string *)&this->_name);
  this->_name_encoded = false;
  std::__cxx11::string::string((string *)&this->_string);
  this->_string_encoded = false;
  (this->_value)._number = 0.0;
  this->refcount = 1;
  this->fetched = true;
  pjVar1 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
  std::__cxx11::string::string((string *)&this->_comment,(string *)pjVar1);
  if ((this->_type == '\x05') || (this->_type == '\x04')) {
    local_60 = jsonChildren::newChildren();
  }
  else {
    local_60 = (jsonChildren *)0x0;
  }
  this->Children = local_60;
  psVar2 = getCtorCounter();
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

inline internalJSONNode::internalJSONNode(char mytype) json_nothrow : _type(mytype), _name(), _name_encoded(), _string(), _string_encoded(), _value()
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(true)
    initializeComment(json_global(EMPTY_JSON_STRING))
    initializeChildren((_type == JSON_NODE || _type == JSON_ARRAY) ? jsonChildren::newChildren() : 0){

    LIBJSON_CTOR;

    #ifdef JSON_LESS_MEMORY
	   //if not less memory, its in the initialization list
	   if (isContainer()){
		  CHILDREN = jsonChildren::newChildren();
	   }
    #endif
}